

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O3

bool __thiscall DIS::Environment::operator==(Environment *this,Environment *rhs)

{
  return (this->_length == rhs->_length && this->_environmentType == rhs->_environmentType) &&
         (this->_padding == rhs->_padding && rhs->_index == this->_index);
}

Assistant:

bool Environment::operator ==(const Environment& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_environmentType == rhs._environmentType) ) ivarsEqual = false;
     if( ! (_length == rhs._length) ) ivarsEqual = false;
     if( ! (_index == rhs._index) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }